

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O1

int xmlParse3986Segment(xmlURIPtr uri,char **str,char forbid,int empty)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  byte *cur;
  byte *cur_00;
  bool bVar4;
  
  cur = (byte *)*str;
  iVar2 = xmlIsUnreserved(uri,(char *)cur);
  if (((iVar2 == 0) &&
      ((uVar3 = *cur - 0x21, 0x1f < uVar3 ||
       (((0x96000fe9U >> (uVar3 & 0x1f) & 1) == 0 &&
        (((uVar3 != 4 ||
          ((9 < (byte)(cur[1] - 0x30) &&
           ((uVar3 = cur[1] - 0x41, 0x25 < uVar3 ||
            ((0x3f0000003fU >> ((ulong)uVar3 & 0x3f) & 1) == 0)))))) ||
         ((9 < (byte)(cur[2] - 0x30) &&
          ((uVar3 = cur[2] - 0x41, 0x25 < uVar3 ||
           ((0x3f0000003fU >> ((ulong)uVar3 & 0x3f) & 1) == 0)))))))))))) ||
     (bVar1 = *cur, bVar1 == forbid)) {
    uVar3 = (uint)(empty == 0);
  }
  else {
    do {
      bVar4 = bVar1 == 0x25;
      cur_00 = cur + (ulong)bVar4 * 2 + 1;
      iVar2 = xmlIsUnreserved(uri,(char *)cur_00);
      if ((iVar2 == 0) &&
         ((uVar3 = *cur_00 - 0x21, 0x1f < uVar3 ||
          (((0x96000fe9U >> (uVar3 & 0x1f) & 1) == 0 &&
           (((uVar3 != 4 ||
             ((9 < (byte)(cur[(ulong)bVar4 * 2 + 2] - 0x30) &&
              ((uVar3 = cur[(ulong)bVar4 * 2 + 2] - 0x41, 0x25 < uVar3 ||
               ((0x3f0000003fU >> ((ulong)uVar3 & 0x3f) & 1) == 0)))))) ||
            ((9 < (byte)(cur[(ulong)bVar4 * 2 + 3] - 0x30) &&
             ((uVar3 = cur[(ulong)bVar4 * 2 + 3] - 0x41, 0x25 < uVar3 ||
              ((0x3f0000003fU >> ((ulong)uVar3 & 0x3f) & 1) == 0)))))))))))) break;
      bVar1 = *cur_00;
      cur = cur_00;
    } while (bVar1 != forbid);
    *str = (char *)cur_00;
    uVar3 = 0;
  }
  return uVar3;
}

Assistant:

static int
xmlParse3986Segment(xmlURIPtr uri, const char **str, char forbid, int empty)
{
    const char *cur;

    cur = *str;
    if (!ISA_PCHAR(uri, cur) || (*cur == forbid)) {
        if (empty)
	    return(0);
	return(1);
    }
    NEXT(cur);

#if defined(_WIN32) || defined(__CYGWIN__)
    /*
     * Allow Windows drive letters.
     */
    if ((forbid == ':') && (*cur == forbid))
        NEXT(cur);
#endif

    while (ISA_PCHAR(uri, cur) && (*cur != forbid))
        NEXT(cur);
    *str = cur;
    return (0);
}